

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O1

void __thiscall TEST_SimpleString_MemCmp_Test::testBody(TEST_SimpleString_MemCmp_Test *this)

{
  int iVar1;
  uint uVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  uchar greater [4];
  uchar smaller [4];
  
  _greater = 0xff2a0100ffff0100;
  pUVar3 = UtestShell::getCurrent();
  iVar1 = SimpleString::MemCmp(smaller,smaller,4);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0,(long)iVar1,
             "LONGS_EQUAL(0, SimpleString::MemCmp(smaller, smaller, sizeof(smaller))) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x45e,pTVar4);
  pUVar3 = UtestShell::getCurrent();
  uVar2 = SimpleString::MemCmp(smaller,greater,4);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(uVar2 >> 0x1f),"CHECK",
             "SimpleString::MemCmp(smaller, greater, sizeof(smaller)) < 0",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x45f,pTVar4);
  pUVar3 = UtestShell::getCurrent();
  iVar1 = SimpleString::MemCmp(greater,smaller,4);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(0 < iVar1),"CHECK",
             "SimpleString::MemCmp(greater, smaller, sizeof(smaller)) > 0",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x460,pTVar4);
  pUVar3 = UtestShell::getCurrent();
  iVar1 = SimpleString::MemCmp((void *)0x0,(void *)0x0,0);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0,(long)iVar1,"LONGS_EQUAL(0, SimpleString::MemCmp(NULLPTR, NULLPTR, 0)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x461,pTVar4);
  return;
}

Assistant:

TEST(SimpleString, MemCmp)
{
    unsigned char smaller[] = { 0x00, 0x01, 0x2A, 0xFF };
    unsigned char greater[] = { 0x00, 0x01, 0xFF, 0xFF };

    LONGS_EQUAL(0, SimpleString::MemCmp(smaller, smaller, sizeof(smaller)));
    CHECK(SimpleString::MemCmp(smaller, greater, sizeof(smaller)) < 0);
    CHECK(SimpleString::MemCmp(greater, smaller, sizeof(smaller)) > 0);
    LONGS_EQUAL(0, SimpleString::MemCmp(NULLPTR, NULLPTR, 0));
}